

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O1

int32_t __thiscall
icu_63::Normalizer2WithImpl::spanQuickCheckYes
          (Normalizer2WithImpl *this,UnicodeString *s,UErrorCode *errorCode)

{
  ushort uVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  char16_t *pcVar4;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar4 = (s->fUnion).fFields.fArray;
    }
    else {
      pcVar4 = (char16_t *)((long)&s->fUnion + 2);
    }
  }
  else {
    pcVar4 = (char16_t *)0x0;
  }
  if (pcVar4 == (char16_t *)0x0) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    iVar3 = 0;
  }
  else {
    if ((short)uVar1 < 0) {
      iVar2 = (s->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)(short)uVar1 >> 5;
    }
    iVar2 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x14])
                      (this,pcVar4,pcVar4 + iVar2);
    iVar3 = (int32_t)((ulong)(CONCAT44(extraout_var,iVar2) - (long)pcVar4) >> 1);
  }
  return iVar3;
}

Assistant:

virtual int32_t
    spanQuickCheckYes(const UnicodeString &s, UErrorCode &errorCode) const {
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        const UChar *sArray=s.getBuffer();
        if(sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        return (int32_t)(spanQuickCheckYes(sArray, sArray+s.length(), errorCode)-sArray);
    }